

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

void prvTidyUngetChar(uint c,StreamIn *in)

{
  ushort uVar1;
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var2;
  unsigned_short uVar3;
  tchar *ptVar4;
  uint uVar5;
  uint uVar6;
  
  if (c != 0xffffffff) {
    in->pushed = yes;
    uVar5 = in->bufpos;
    uVar6 = uVar5 + 1;
    if (uVar6 < in->bufsize) {
      ptVar4 = in->charbuf;
    }
    else {
      p_Var2 = in->allocator->vtbl->realloc;
      uVar5 = in->bufsize + 1;
      in->bufsize = uVar5;
      ptVar4 = (tchar *)(*p_Var2)(in->allocator,in->charbuf,(ulong)uVar5 << 2);
      in->charbuf = ptVar4;
      uVar5 = in->bufpos;
      uVar6 = uVar5 + 1;
    }
    in->bufpos = uVar6;
    ptVar4[uVar5] = c;
    if (c == 10) {
      in->curline = in->curline + -1;
    }
    uVar1 = in->curlastpos;
    if (in->firstlastpos == uVar1) {
      in->curcol = 0;
    }
    else {
      in->curcol = in->lastcols[uVar1];
      uVar3 = 0x3f;
      if ((ulong)uVar1 != 0) {
        uVar3 = uVar1 - 1;
      }
      in->curlastpos = uVar3;
    }
  }
  return;
}

Assistant:

void TY_(UngetChar)( uint c, StreamIn *in )
{
    if (c == EndOfStream)
    {
        /* fprintf(stderr, "Attempt to UngetChar EOF\n"); */
        return;
    }
    
    in->pushed = yes;

    if (in->bufpos + 1 >= in->bufsize)
        in->charbuf = (tchar*)TidyRealloc(in->allocator, in->charbuf, sizeof(tchar) * ++(in->bufsize));

    in->charbuf[(in->bufpos)++] = c;

    if (c == '\n')
        --(in->curline);

    RestoreLastPos( in );
}